

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CClient.cpp
# Opt level: O3

ssize_t __thiscall CClient::sendErrorMsg(CClient *this)

{
  ssize_t sVar1;
  string ret;
  undefined1 *local_30;
  size_t local_28;
  undefined1 local_20 [16];
  
  if ((int)this->m_State < 2) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"530 Please login with USER and PASS.\r\n","");
    sVar1 = write(this->m_Flag,local_30,local_28);
  }
  else {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"500 Unknown command.\r\n","");
    sVar1 = write(this->m_Flag,local_30,local_28);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return sVar1;
}

Assistant:

ssize_t CClient::sendErrorMsg() {
    if(m_State < USER){
        string ret = "530 Please login with USER and PASS.\r\n";
        return sendMsg(ret);
    }
    else{
        string ret = "500 Unknown command.\r\n";
        return sendMsg(ret);
    }
}